

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseAndBuildFileWithErrors
          (ValidationErrorTest *this,string_view file_name,string_view file_text,
          string_view expected_errors)

{
  FileDescriptor *pFVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *pcVar2;
  MockErrorCollector error_collector;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_178;
  Message local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  AssertHelper local_160;
  MockErrorCollector local_158;
  undefined1 local_110 [8];
  InternalMetadata local_108;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_100;
  
  pcVar2 = file_text._M_str;
  local_158.text_._M_dataplus._M_p = (pointer)&local_158.text_.field_2;
  local_158.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__MockErrorCollector_018e1730;
  local_158.text_._M_string_length = 0;
  local_158.text_.field_2._M_local_buf[0] = '\0';
  local_158.warning_text_._M_dataplus._M_p = (pointer)&local_158.warning_text_.field_2;
  local_158.warning_text_._M_string_length = 0;
  local_158.warning_text_.field_2._M_local_buf[0] = '\0';
  ParseFile((FileDescriptorProto *)local_110,this,file_name,file_text);
  pFVar1 = DescriptorPool::BuildFileCollectingErrors
                     (&this->pool_,(FileDescriptorProto *)local_110,&local_158.super_ErrorCollector)
  ;
  local_170.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(pFVar1 == (FileDescriptor *)0x0);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
  if (local_170.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)&local_170,
               (AssertionResult *)
               "pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text), &error_collector) == nullptr"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1201,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
        CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
                      CONCAT71(local_110._1_7_,local_110[0]),local_100._0_8_ + 1);
    }
    if (local_178._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_178._M_head_impl + 8))();
    }
  }
  if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168,local_168);
  }
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((internal *)local_110,"expected_errors","error_collector.text_",&expected_errors,
             &local_158.text_);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message(&local_170);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_108.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1202,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if ((long *)CONCAT71(local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108.ptr_
                );
  }
  MockErrorCollector::~MockErrorCollector(&local_158);
  return;
}

Assistant:

void ParseAndBuildFileWithErrors(absl::string_view file_name,
                                   absl::string_view file_text,
                                   absl::string_view expected_errors) {
    MockErrorCollector error_collector;
    EXPECT_TRUE(pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text),
                                                &error_collector) == nullptr);
    EXPECT_EQ(expected_errors, error_collector.text_);
  }